

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::exit(App *this,int __status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *pEVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ostream *local_80;
  string local_78;
  string local_58;
  App *local_38;
  
  pEVar5 = (Error *)CONCAT44(in_register_00000034,__status);
  paVar1 = &local_a0.field_2;
  pcVar2 = (pEVar5->error_name)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  local_80 = in_RCX;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (pEVar5->error_name)._M_string_length);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_a0,"RuntimeError");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    return;
  }
  pcVar2 = (pEVar5->error_name)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (pEVar5->error_name)._M_string_length);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_a0,"CallForHelp");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    help(&local_a0,this,&local_58,Normal);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (in_RDX,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _Var6._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  else {
    pcVar2 = (pEVar5->error_name)._M_dataplus._M_p;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,pcVar2 + (pEVar5->error_name)._M_string_length);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_a0,"CallForAllHelp");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 != 0) {
      pcVar2 = (pEVar5->error_name)._M_dataplus._M_p;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,pcVar2 + (pEVar5->error_name)._M_string_length);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_a0,"CallForVersion");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        __s = (char *)(**(code **)(*(long *)pEVar5 + 0x10))(pEVar5);
        if (__s == (char *)0x0) {
          ::std::ios::clear((int)in_RDX + (int)*(undefined8 *)(*(long *)in_RDX + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          ::std::__ostream_insert<char,std::char_traits<char>>(in_RDX,__s,sVar4);
        }
        local_a0._M_dataplus._M_p._0_1_ = 10;
        ::std::__ostream_insert<char,std::char_traits<char>>(in_RDX,(char *)&local_a0,1);
        return;
      }
      if (pEVar5->actual_exit_code == 0) {
        return;
      }
      if ((this->failure_message_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      local_38 = this;
      (*(this->failure_message_)._M_invoker)
                (&local_a0,(_Any_data *)&this->failure_message_,&local_38,pEVar5);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_80,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      ::std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == paVar1) {
        return;
      }
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      return;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    help(&local_a0,this,&local_78,All);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (in_RDX,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_58.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
    _Var6._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return;
    }
  }
  operator_delete(_Var6._M_p,local_58.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

CLI11_INLINE int App::exit(const Error &e, std::ostream &out, std::ostream &err) const {

    /// Avoid printing anything if this is a CLI::RuntimeError
    if(e.get_name() == "RuntimeError")
        return e.get_exit_code();

    if(e.get_name() == "CallForHelp") {
        out << help();
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForAllHelp") {
        out << help("", AppFormatMode::All);
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForVersion") {
        out << e.what() << '\n';
        return e.get_exit_code();
    }

    if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
        if(failure_message_)
            err << failure_message_(this, e) << std::flush;
    }

    return e.get_exit_code();
}